

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HtmlBuilder.h
# Opt level: O3

void __thiscall HTML::TAG::~TAG(TAG *this)

{
  ~TAG(this);
  operator_delete(this,0x1b8);
  return;
}

Assistant:

virtual ~TAG() {
    m_stream << m_value.str();
    m_stream << "</" << m_tag << ">";
  }